

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::EnumValueDescriptorProto::Clear(EnumValueDescriptorProto *this)

{
  uint uVar1;
  LogMessage *pLVar2;
  string *psVar3;
  EnumValueOptions *this_00;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar3 = (this->name_).ptr_;
      if (psVar3 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x197b);
        pLVar2 = internal::LogMessage::operator<<
                           (&local_48,
                            "CHECK failed: !name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(&local_49,pLVar2);
        internal::LogMessage::~LogMessage(&local_48);
        psVar3 = (this->name_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 2) != 0) {
      this_00 = this->options_;
      if (this_00 == (EnumValueOptions *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x197f);
        pLVar2 = internal::LogMessage::operator<<(&local_48,"CHECK failed: options_ != NULL: ");
        internal::LogFinisher::operator=(&local_49,pLVar2);
        internal::LogMessage::~LogMessage(&local_48);
        this_00 = this->options_;
      }
      EnumValueOptions::Clear(this_00);
    }
  }
  this->number_ = 0;
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void EnumValueDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.EnumValueDescriptorProto)
  if (_has_bits_[0 / 32] & 3u) {
    if (has_name()) {
      GOOGLE_DCHECK(!name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*name_.UnsafeRawStringPointer())->clear();
    }
    if (has_options()) {
      GOOGLE_DCHECK(options_ != NULL);
      options_->::google::protobuf::EnumValueOptions::Clear();
    }
  }
  number_ = 0;
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}